

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  REF_INT node3;
  REF_INT node2;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_DBL quality3;
  REF_DBL quality2;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *allowed = 0;
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&node2,&node3);
  if (uVar1 == 0) {
    uVar1 = ref_cell_list_with2(ref_cell,node0,node1,2,&ncell,cell_to_swap);
    if (uVar1 == 0) {
      if ((long)ncell != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x290,"ref_swap_quality","there should be two triangles for manifold",2,(long)ncell);
        return 1;
      }
      uVar1 = ref_cell_nodes(ref_cell,cell_to_swap[0],nodes);
      if (uVar1 == 0) {
        uVar1 = ref_node_tri_quality(ref_node,nodes,&quality0);
        if (uVar1 == 0) {
          uVar1 = ref_cell_nodes(ref_cell,cell_to_swap[1],nodes);
          if (uVar1 == 0) {
            uVar1 = ref_node_tri_quality(ref_node,nodes,&quality1);
            if (uVar1 == 0) {
              nodes[1] = node3;
              nodes[2] = node2;
              nodes[0] = node0;
              uVar1 = ref_node_tri_quality(ref_node,nodes,&quality2);
              if (uVar1 == 0) {
                nodes[1] = node2;
                nodes[2] = node3;
                nodes[0] = node1;
                uVar1 = ref_node_tri_quality(ref_node,nodes,&quality3);
                if (uVar1 == 0) {
                  if (quality3 <= quality2) {
                    quality2 = quality3;
                  }
                  if (quality1 <= quality0) {
                    quality0 = quality1;
                  }
                  if (quality0 <= quality2) {
                    *allowed = 1;
                  }
                  else {
                    *allowed = 0;
                  }
                  return 0;
                }
                uVar3 = (ulong)uVar1;
                pcVar4 = "qual";
                uVar2 = 0x29d;
              }
              else {
                uVar3 = (ulong)uVar1;
                pcVar4 = "qual";
                uVar2 = 0x299;
              }
            }
            else {
              uVar3 = (ulong)uVar1;
              pcVar4 = "qual";
              uVar2 = 0x295;
            }
          }
          else {
            uVar3 = (ulong)uVar1;
            pcVar4 = "nodes tri1";
            uVar2 = 0x294;
          }
        }
        else {
          uVar3 = (ulong)uVar1;
          pcVar4 = "qual";
          uVar2 = 0x293;
        }
      }
      else {
        uVar3 = (ulong)uVar1;
        pcVar4 = "nodes tri0";
        uVar2 = 0x292;
      }
    }
    else {
      uVar3 = (ulong)uVar1;
      pcVar4 = "more then two";
      uVar2 = 0x28f;
    }
  }
  else {
    uVar3 = (ulong)uVar1;
    pcVar4 = "other nodes";
    uVar2 = 0x28c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar2,
         "ref_swap_quality",uVar3,pcVar4);
  return (REF_STATUS)uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_swap_quality(REF_GRID ref_grid, REF_INT node0,
                                    REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_DBL quality0, quality1, quality2, quality3;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality0), "qual");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality1), "qual");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality2), "qual");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality3), "qual");

  if (MIN(quality2, quality3) < MIN(quality0, quality1)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  *allowed = REF_TRUE;
  return REF_SUCCESS;
}